

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O2

void cueify_sha1_transform(uint32_t *state,uint8_t *buffer)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  
  uVar5 = *state;
  uVar1 = state[1];
  uVar2 = state[2];
  uVar11 = state[3];
  uVar3 = *(uint *)buffer;
  uVar4 = *(uint *)(buffer + 4);
  uVar9 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  uVar6 = ((uVar11 ^ uVar2) & uVar1 ^ uVar11) + uVar9 + 0x5a827999 +
          (uVar5 << 5 | uVar5 >> 0x1b) + state[4];
  uVar3 = uVar1 << 0x1e | uVar1 >> 2;
  uVar7 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  uVar11 = uVar11 + uVar7 + ((uVar3 ^ uVar2) & uVar5 ^ uVar2) + 0x5a827999 +
           (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar18 = uVar5 << 0x1e | uVar5 >> 2;
  uVar5 = *(uint *)(buffer + 8);
  uVar1 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  uVar15 = uVar2 + uVar1 + ((uVar3 ^ uVar18) & uVar6 ^ uVar3) + 0x5a827999 +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar5 = *(uint *)(buffer + 0xc);
  uVar2 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  uVar4 = uVar3 + uVar2 + ((uVar6 ^ uVar18) & uVar11 ^ uVar18) + 0x5a827999 +
          (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar12 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar5 = *(uint *)(buffer + 0x10);
  uVar11 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  uVar16 = uVar15 * 0x40000000 | uVar15 >> 2;
  uVar19 = uVar18 + uVar11 + ((uVar12 ^ uVar6) & uVar15 ^ uVar6) + 0x5a827999 +
           (uVar4 * 0x20 | uVar4 >> 0x1b);
  uVar5 = *(uint *)(buffer + 0x14);
  uVar3 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  uVar18 = uVar6 + uVar3 + ((uVar16 ^ uVar12) & uVar4 ^ uVar12) + 0x5a827999 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar15 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar5 = *(uint *)(buffer + 0x18);
  uVar4 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  uVar12 = uVar12 + uVar4 + ((uVar15 ^ uVar16) & uVar19 ^ uVar16) + 0x5a827999 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar20 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar5 = *(uint *)(buffer + 0x1c);
  uVar6 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  uVar19 = uVar16 + uVar6 + ((uVar20 ^ uVar15) & uVar18 ^ uVar15) + 0x5a827999 +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar16 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar5 = *(uint *)(buffer + 0x20);
  uVar8 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  uVar13 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar12 = uVar15 + uVar8 + ((uVar16 ^ uVar20) & uVar12 ^ uVar20) + 0x5a827999 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar5 = *(uint *)(buffer + 0x24);
  uVar15 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  uVar21 = uVar20 + uVar15 + ((uVar13 ^ uVar16) & uVar19 ^ uVar16) + 0x5a827999 +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar17 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar5 = *(uint *)(buffer + 0x28);
  uVar18 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  uVar19 = uVar16 + uVar18 + ((uVar17 ^ uVar13) & uVar12 ^ uVar13) + 0x5a827999 +
           (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar20 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar5 = *(uint *)(buffer + 0x2c);
  uVar12 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  uVar14 = uVar13 + uVar12 + ((uVar20 ^ uVar17) & uVar21 ^ uVar17) + 0x5a827999 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar22 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar5 = *(uint *)(buffer + 0x30);
  uVar16 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  uVar13 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar21 = uVar17 + uVar16 + ((uVar22 ^ uVar20) & uVar19 ^ uVar20) + 0x5a827999 +
           (uVar14 * 0x20 | uVar14 >> 0x1b);
  uVar5 = *(uint *)(buffer + 0x34);
  uVar19 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  uVar20 = uVar20 + uVar19 + ((uVar13 ^ uVar22) & uVar14 ^ uVar22) + 0x5a827999 +
           (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar17 = uVar14 * 0x40000000 | uVar14 >> 2;
  uVar5 = *(uint *)(buffer + 0x38);
  uVar14 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  uVar23 = uVar22 + uVar14 + ((uVar17 ^ uVar13) & uVar21 ^ uVar13) + 0x5a827999 +
           (uVar20 * 0x20 | uVar20 >> 0x1b);
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar5 = *(uint *)(buffer + 0x3c);
  uVar22 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  uVar13 = uVar13 + uVar22 + ((uVar21 ^ uVar17) & uVar20 ^ uVar17) + 0x5a827999 +
           (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar9 = uVar8 ^ uVar19 ^ uVar9 ^ uVar1;
  uVar5 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar26 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar24 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar9 = uVar17 + uVar26 + ((uVar5 ^ uVar21) & uVar23 ^ uVar21) + 0x5a827999 +
          (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar20 = uVar15 ^ uVar14 ^ uVar7 ^ uVar2;
  uVar10 = uVar20 << 1 | (uint)((int)uVar20 < 0);
  uVar21 = uVar21 + uVar10 + ((uVar24 ^ uVar5) & uVar13 ^ uVar5) + 0x5a827999 +
           (uVar9 * 0x20 | uVar9 >> 0x1b);
  uVar1 = uVar18 ^ uVar22 ^ uVar1 ^ uVar11;
  uVar13 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar20 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  uVar5 = uVar5 + uVar20 + ((uVar13 ^ uVar24) & uVar9 ^ uVar24) + 0x5a827999 +
          (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar7 = uVar9 * 0x40000000 | uVar9 >> 2;
  uVar1 = uVar2 ^ uVar3 ^ uVar12 ^ uVar26;
  uVar17 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  uVar23 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar21 = uVar24 + uVar17 + ((uVar7 ^ uVar13) & uVar21 ^ uVar13) + 0x5a827999 +
           (uVar5 * 0x20 | uVar5 >> 0x1b);
  uVar1 = uVar11 ^ uVar4 ^ uVar16 ^ uVar10;
  uVar9 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  uVar1 = uVar13 + uVar9 + (uVar23 ^ uVar7 ^ uVar5) + 0x6ed9eba1 + (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar2 = uVar3 ^ uVar6 ^ uVar19 ^ uVar20;
  uVar13 = uVar2 << 1 | (uint)((int)uVar2 < 0);
  uVar3 = uVar7 + uVar13 + (uVar5 ^ uVar23 ^ uVar21) + 0x6ed9eba1 + (uVar1 * 0x20 | uVar1 >> 0x1b);
  uVar24 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar2 = uVar4 ^ uVar8 ^ uVar14 ^ uVar17;
  uVar7 = uVar2 << 1 | (uint)((int)uVar2 < 0);
  uVar11 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar4 = uVar23 + uVar7 + (uVar24 ^ uVar5 ^ uVar1) + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b);
  uVar1 = uVar6 ^ uVar15 ^ uVar22 ^ uVar9;
  uVar21 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  uVar5 = uVar5 + uVar21 + (uVar11 ^ uVar24 ^ uVar3) + 0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b);
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar1 = uVar8 ^ uVar18 ^ uVar26 ^ uVar13;
  uVar2 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  uVar24 = uVar24 + uVar2 + (uVar3 ^ uVar11 ^ uVar4) + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b);
  uVar6 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar1 = uVar15 ^ uVar12 ^ uVar10 ^ uVar7;
  uVar8 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  uVar1 = uVar11 + uVar8 + (uVar6 ^ uVar3 ^ uVar5) + 0x6ed9eba1 + (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar11 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar5 = uVar18 ^ uVar16 ^ uVar20 ^ uVar21;
  uVar23 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar25 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar3 = uVar3 + uVar23 + (uVar11 ^ uVar6 ^ uVar24) + 0x6ed9eba1 + (uVar1 * 0x20 | uVar1 >> 0x1b);
  uVar5 = uVar12 ^ uVar19 ^ uVar17 ^ uVar2;
  uVar4 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar18 = uVar6 + uVar4 + (uVar25 ^ uVar11 ^ uVar1) + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b);
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar5 = uVar16 ^ uVar14 ^ uVar9 ^ uVar8;
  uVar6 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar11 = uVar11 + uVar6 + (uVar1 ^ uVar25 ^ uVar3) + 0x6ed9eba1 + (uVar18 * 0x20 | uVar18 >> 0x1b)
  ;
  uVar15 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar5 = uVar19 ^ uVar22 ^ uVar13 ^ uVar23;
  uVar24 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar12 = uVar25 + uVar24 + (uVar15 ^ uVar1 ^ uVar18) + 0x6ed9eba1 +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar19 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar5 = uVar14 ^ uVar26 ^ uVar7 ^ uVar4;
  uVar5 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar18 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar3 = uVar1 + uVar5 + (uVar19 ^ uVar15 ^ uVar11) + 0x6ed9eba1 + (uVar12 * 0x20 | uVar12 >> 0x1b)
  ;
  uVar1 = uVar22 ^ uVar10 ^ uVar21 ^ uVar6;
  uVar11 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  uVar16 = uVar15 + uVar11 + (uVar18 ^ uVar19 ^ uVar12) + 0x6ed9eba1 +
           (uVar3 * 0x20 | uVar3 >> 0x1b);
  uVar12 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar1 = uVar26 ^ uVar20 ^ uVar2 ^ uVar24;
  uVar25 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  uVar19 = uVar19 + uVar25 + (uVar12 ^ uVar18 ^ uVar3) + 0x6ed9eba1 +
           (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar15 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar1 = uVar10 ^ uVar17 ^ uVar8 ^ uVar5;
  uVar22 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  uVar18 = uVar18 + uVar22 + (uVar15 ^ uVar12 ^ uVar16) + 0x6ed9eba1 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar16 = uVar16 * 0x40000000 | uVar16 >> 2;
  uVar1 = uVar20 ^ uVar9 ^ uVar23 ^ uVar11;
  uVar3 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  uVar10 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar12 = uVar12 + uVar3 + (uVar16 ^ uVar15 ^ uVar19) + 0x6ed9eba1 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar1 = uVar17 ^ uVar13 ^ uVar4 ^ uVar25;
  uVar20 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  uVar1 = uVar15 + uVar20 + (uVar10 ^ uVar16 ^ uVar18) + 0x6ed9eba1 +
          (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar15 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar18 = uVar9 ^ uVar7 ^ uVar6 ^ uVar22;
  uVar14 = uVar18 << 1 | (uint)((int)uVar18 < 0);
  uVar16 = uVar16 + uVar14 + (uVar15 ^ uVar10 ^ uVar12) + 0x6ed9eba1 +
           (uVar1 * 0x20 | uVar1 >> 0x1b);
  uVar18 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar12 = uVar13 ^ uVar21 ^ uVar24 ^ uVar3;
  uVar13 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  uVar17 = uVar10 + uVar13 + (uVar18 ^ uVar15 ^ uVar1) + 0x6ed9eba1 +
           (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar12 = uVar7 ^ uVar2 ^ uVar5 ^ uVar20;
  uVar7 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  uVar19 = uVar16 * 0x40000000 | uVar16 >> 2;
  uVar15 = uVar15 + uVar7 + (uVar1 ^ uVar18 ^ uVar16) + 0x6ed9eba1 +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar12 = uVar21 ^ uVar8 ^ uVar11 ^ uVar14;
  uVar9 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  uVar16 = uVar18 + uVar9 + (uVar19 ^ uVar1 ^ uVar17) + 0x6ed9eba1 +
           (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar17 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar2 = uVar2 ^ uVar23 ^ uVar25 ^ uVar13;
  uVar10 = uVar2 << 1 | (uint)((int)uVar2 < 0);
  uVar2 = uVar1 + uVar10 + (uVar15 & uVar17 | (uVar15 | uVar17) & uVar19) + -0x70e44324 +
          (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar18 = uVar15 * 0x40000000 | uVar15 >> 2;
  uVar1 = uVar8 ^ uVar4 ^ uVar22 ^ uVar7;
  uVar12 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  uVar8 = uVar19 + uVar12 + (uVar16 & uVar18 | (uVar16 | uVar18) & uVar17) + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b);
  uVar19 = uVar16 * 0x40000000 | uVar16 >> 2;
  uVar1 = uVar23 ^ uVar6 ^ uVar3 ^ uVar9;
  uVar1 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  uVar17 = uVar17 + uVar1 + (uVar2 & uVar19 | (uVar2 | uVar19) & uVar18) + -0x70e44324 +
           (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar15 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar2 = uVar4 ^ uVar24 ^ uVar20 ^ uVar10;
  uVar16 = uVar2 << 1 | (uint)((int)uVar2 < 0);
  uVar18 = uVar18 + uVar16 + (uVar8 & uVar15 | (uVar8 | uVar15) & uVar19) + -0x70e44324 +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar8 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar2 = uVar6 ^ uVar5 ^ uVar14 ^ uVar12;
  uVar2 = uVar2 << 1 | (uint)((int)uVar2 < 0);
  uVar19 = uVar19 + uVar2 + (uVar17 & uVar8 | (uVar17 | uVar8) & uVar15) + -0x70e44324 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar21 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar4 = uVar24 ^ uVar11 ^ uVar13 ^ uVar1;
  uVar17 = uVar4 << 1 | (uint)((int)uVar4 < 0);
  uVar4 = uVar15 + uVar17 + (uVar18 & uVar21 | (uVar18 | uVar21) & uVar8) + -0x70e44324 +
          (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar15 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar5 = uVar5 ^ uVar25 ^ uVar7 ^ uVar16;
  uVar6 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar8 = uVar8 + uVar6 + (uVar19 & uVar15 | (uVar19 | uVar15) & uVar21) + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b);
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar5 = uVar11 ^ uVar22 ^ uVar9 ^ uVar2;
  uVar5 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar23 = uVar21 + uVar5 + (uVar4 & uVar19 | (uVar4 | uVar19) & uVar15) + -0x70e44324 +
           (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar11 = uVar25 ^ uVar3 ^ uVar10 ^ uVar17;
  uVar25 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar18 = uVar15 + uVar25 + (uVar8 & uVar4 | (uVar8 | uVar4) & uVar19) + -0x70e44324 +
           (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar8 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar11 = uVar22 ^ uVar20 ^ uVar12 ^ uVar6;
  uVar21 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar19 = uVar19 + uVar21 + (uVar23 & uVar8 | (uVar23 | uVar8) & uVar4) + -0x70e44324 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar23 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar11 = uVar3 ^ uVar14 ^ uVar1 ^ uVar5;
  uVar15 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar11 = uVar4 + uVar15 + (uVar18 & uVar23 | (uVar18 | uVar23) & uVar8) + -0x70e44324 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar3 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar4 = uVar20 ^ uVar13 ^ uVar16 ^ uVar25;
  uVar24 = uVar4 << 1 | (uint)((int)uVar4 < 0);
  uVar22 = uVar8 + uVar24 + (uVar19 & uVar3 | (uVar19 | uVar3) & uVar23) + -0x70e44324 +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar4 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar18 = uVar14 ^ uVar7 ^ uVar2 ^ uVar21;
  uVar8 = uVar18 << 1 | (uint)((int)uVar18 < 0);
  uVar19 = uVar23 + uVar8 + (uVar11 & uVar4 | (uVar11 | uVar4) & uVar3) + -0x70e44324 +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar18 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar11 = uVar13 ^ uVar9 ^ uVar17 ^ uVar15;
  uVar11 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar20 = uVar3 + uVar11 + (uVar22 & uVar18 | (uVar22 | uVar18) & uVar4) + -0x70e44324 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar14 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar3 = uVar7 ^ uVar10 ^ uVar6 ^ uVar24;
  uVar3 = uVar3 << 1 | (uint)((int)uVar3 < 0);
  uVar13 = uVar4 + uVar3 + (uVar19 & uVar14 | (uVar19 | uVar14) & uVar18) + -0x70e44324 +
           (uVar20 * 0x20 | uVar20 >> 0x1b);
  uVar22 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar4 = uVar9 ^ uVar12 ^ uVar5 ^ uVar8;
  uVar4 = uVar4 << 1 | (uint)((int)uVar4 < 0);
  uVar19 = uVar18 + uVar4 + (uVar20 & uVar22 | (uVar20 | uVar22) & uVar14) + -0x70e44324 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar18 = uVar10 ^ uVar1 ^ uVar25 ^ uVar11;
  uVar18 = uVar18 << 1 | (uint)((int)uVar18 < 0);
  uVar7 = uVar14 + uVar18 + (uVar13 & uVar20 | (uVar13 | uVar20) & uVar22) + -0x70e44324 +
          (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar13 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar12 = uVar12 ^ uVar16 ^ uVar21 ^ uVar3;
  uVar12 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  uVar14 = uVar22 + uVar12 + (uVar19 & uVar13 | (uVar19 | uVar13) & uVar20) + -0x70e44324 +
           (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar1 = uVar1 ^ uVar2 ^ uVar15 ^ uVar4;
  uVar1 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  uVar20 = uVar20 + uVar1 + (uVar7 & uVar19 | (uVar7 | uVar19) & uVar13) + -0x70e44324 +
           (uVar14 * 0x20 | uVar14 >> 0x1b);
  uVar9 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar16 = uVar16 ^ uVar17 ^ uVar24 ^ uVar18;
  uVar16 = uVar16 << 1 | (uint)((int)uVar16 < 0);
  uVar7 = uVar13 + uVar16 + (uVar14 & uVar9 | (uVar14 | uVar9) & uVar19) + -0x70e44324 +
          (uVar20 * 0x20 | uVar20 >> 0x1b);
  uVar22 = uVar14 * 0x40000000 | uVar14 >> 2;
  uVar2 = uVar2 ^ uVar6 ^ uVar8 ^ uVar12;
  uVar14 = uVar2 << 1 | (uint)((int)uVar2 < 0);
  uVar13 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar2 = uVar19 + uVar14 + (uVar22 ^ uVar9 ^ uVar20) + -0x359d3e2a + (uVar7 * 0x20 | uVar7 >> 0x1b)
  ;
  uVar19 = uVar17 ^ uVar5 ^ uVar11 ^ uVar1;
  uVar17 = uVar19 << 1 | (uint)((int)uVar19 < 0);
  uVar20 = uVar9 + uVar17 + (uVar13 ^ uVar22 ^ uVar7) + -0x359d3e2a + (uVar2 * 0x20 | uVar2 >> 0x1b)
  ;
  uVar19 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar6 = uVar6 ^ uVar25 ^ uVar3 ^ uVar16;
  uVar7 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar6 = uVar22 + uVar7 + (uVar19 ^ uVar13 ^ uVar2) + -0x359d3e2a +
          (uVar20 * 0x20 | uVar20 >> 0x1b);
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar5 = uVar5 ^ uVar21 ^ uVar4 ^ uVar14;
  uVar9 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar5 = uVar13 + uVar9 + (uVar2 ^ uVar19 ^ uVar20) + -0x359d3e2a + (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar13 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar20 = uVar25 ^ uVar15 ^ uVar18 ^ uVar17;
  uVar10 = uVar20 << 1 | (uint)((int)uVar20 < 0);
  uVar23 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar19 = uVar19 + uVar10 + (uVar13 ^ uVar2 ^ uVar6) + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b)
  ;
  uVar6 = uVar21 ^ uVar24 ^ uVar12 ^ uVar7;
  uVar21 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar2 = uVar2 + uVar21 + (uVar23 ^ uVar13 ^ uVar5) + -0x359d3e2a +
          (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar20 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar5 = uVar15 ^ uVar8 ^ uVar1 ^ uVar9;
  uVar6 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar22 = uVar13 + uVar6 + (uVar20 ^ uVar23 ^ uVar19) + -0x359d3e2a +
           (uVar2 * 0x20 | uVar2 >> 0x1b);
  uVar13 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar5 = uVar24 ^ uVar11 ^ uVar16 ^ uVar10;
  uVar15 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar23 = uVar23 + uVar15 + (uVar13 ^ uVar20 ^ uVar2) + -0x359d3e2a +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar19 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar5 = uVar8 ^ uVar3 ^ uVar14 ^ uVar21;
  uVar5 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar8 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar20 = uVar20 + uVar5 + (uVar19 ^ uVar13 ^ uVar22) + -0x359d3e2a +
           (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar2 = uVar11 ^ uVar4 ^ uVar17 ^ uVar6;
  uVar24 = uVar2 << 1 | (uint)((int)uVar2 < 0);
  uVar11 = uVar13 + uVar24 + (uVar8 ^ uVar19 ^ uVar23) + -0x359d3e2a +
           (uVar20 * 0x20 | uVar20 >> 0x1b);
  uVar22 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar2 = uVar3 ^ uVar18 ^ uVar7 ^ uVar15;
  uVar2 = uVar2 << 1 | (uint)((int)uVar2 < 0);
  uVar3 = uVar19 + uVar2 + (uVar22 ^ uVar8 ^ uVar20) + -0x359d3e2a +
          (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar19 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar4 = uVar4 ^ uVar12 ^ uVar9 ^ uVar5;
  uVar13 = uVar4 << 1 | (uint)((int)uVar4 < 0);
  uVar8 = uVar8 + uVar13 + (uVar19 ^ uVar22 ^ uVar11) + -0x359d3e2a + (uVar3 * 0x20 | uVar3 >> 0x1b)
  ;
  uVar20 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar11 = uVar18 ^ uVar1 ^ uVar10 ^ uVar24;
  uVar11 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar4 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar22 = uVar22 + uVar11 + (uVar20 ^ uVar19 ^ uVar3) + -0x359d3e2a +
           (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar3 = uVar12 ^ uVar16 ^ uVar21 ^ uVar2;
  uVar3 = uVar3 << 1 | (uint)((int)uVar3 < 0);
  uVar18 = uVar19 + uVar3 + (uVar4 ^ uVar20 ^ uVar8) + -0x359d3e2a +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  *(uint *)buffer = uVar10;
  *(uint *)(buffer + 4) = uVar21;
  *(uint *)(buffer + 8) = uVar6;
  uVar12 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar1 = uVar1 ^ uVar14 ^ uVar6 ^ uVar13;
  uVar1 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  uVar6 = uVar20 + uVar1 + (uVar12 ^ uVar4 ^ uVar22) + -0x359d3e2a +
          (uVar18 * 0x20 | uVar18 >> 0x1b);
  *(uint *)(buffer + 0xc) = uVar15;
  *(uint *)(buffer + 0x10) = uVar5;
  *(uint *)(buffer + 0x14) = uVar24;
  *(uint *)(buffer + 0x18) = uVar2;
  *(uint *)(buffer + 0x1c) = uVar13;
  *(uint *)(buffer + 0x20) = uVar11;
  uVar11 = uVar16 ^ uVar17 ^ uVar15 ^ uVar11;
  uVar16 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar15 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar11 = uVar4 + uVar15 + (uVar16 ^ uVar12 ^ uVar18) + -0x359d3e2a +
           (uVar6 * 0x20 | uVar6 >> 0x1b);
  *(uint *)(buffer + 0x24) = uVar3;
  uVar4 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar3 = uVar14 ^ uVar7 ^ uVar5 ^ uVar3;
  uVar5 = uVar3 << 1 | (uint)((int)uVar3 < 0);
  uVar18 = uVar12 + uVar5 + (uVar4 ^ uVar16 ^ uVar6) + -0x359d3e2a +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  *(uint *)(buffer + 0x28) = uVar1;
  uVar1 = uVar17 ^ uVar9 ^ uVar24 ^ uVar1;
  *(uint *)(buffer + 0x2c) = uVar15;
  uVar3 = uVar6 * 0x40000000 | uVar6 >> 2;
  *(uint *)(buffer + 0x30) = uVar5;
  uVar1 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  *(uint *)(buffer + 0x34) = uVar1;
  uVar15 = uVar10 ^ uVar7 ^ uVar2 ^ uVar15;
  uVar2 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar6 = uVar15 << 1 | (uint)((int)uVar15 < 0);
  uVar1 = uVar1 + uVar16 + (uVar3 ^ uVar4 ^ uVar11) + -0x359d3e2a + (uVar18 * 0x20 | uVar18 >> 0x1b)
  ;
  *(uint *)(buffer + 0x38) = uVar6;
  uVar5 = uVar21 ^ uVar9 ^ uVar13 ^ uVar5;
  uVar5 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar4 = uVar6 + uVar4 + (uVar2 ^ uVar3 ^ uVar18) + -0x359d3e2a + (uVar1 * 0x20 | uVar1 >> 0x1b);
  *(uint *)(buffer + 0x3c) = uVar5;
  uVar11 = uVar18 * 0x40000000 | uVar18 >> 2;
  *state = uVar5 + *state + uVar3 + (uVar11 ^ uVar2 ^ uVar1) + -0x359d3e2a +
           (uVar4 * 0x20 | uVar4 >> 0x1b);
  state[1] = uVar4 + state[1];
  state[2] = (uVar1 * 0x40000000 | uVar1 >> 2) + state[2];
  state[3] = uVar11 + state[3];
  state[4] = uVar2 + state[4];
  return;
}

Assistant:

void cueify_sha1_transform(uint32_t state[5], const uint8_t buffer[64])
{
    uint32_t a, b, c, d, e;
    typedef union {
        uint8_t c[64];
        uint32_t l[16];
    } CHAR64LONG16;
    CHAR64LONG16* block;

#ifdef SHA1HANDSOFF
    static uint8_t workspace[64];
    block = (CHAR64LONG16*)workspace;
    memcpy(block, buffer, 64);
#else
    block = (CHAR64LONG16*)buffer;
#endif

    /* Copy context->state[] to working vars */
    a = state[0];
    b = state[1];
    c = state[2];
    d = state[3];
    e = state[4];

    /* 4 rounds of 20 operations each. Loop unrolled. */
    R0(a,b,c,d,e, 0); R0(e,a,b,c,d, 1); R0(d,e,a,b,c, 2); R0(c,d,e,a,b, 3);
    R0(b,c,d,e,a, 4); R0(a,b,c,d,e, 5); R0(e,a,b,c,d, 6); R0(d,e,a,b,c, 7);
    R0(c,d,e,a,b, 8); R0(b,c,d,e,a, 9); R0(a,b,c,d,e,10); R0(e,a,b,c,d,11);
    R0(d,e,a,b,c,12); R0(c,d,e,a,b,13); R0(b,c,d,e,a,14); R0(a,b,c,d,e,15);
    R1(e,a,b,c,d,16); R1(d,e,a,b,c,17); R1(c,d,e,a,b,18); R1(b,c,d,e,a,19);
    R2(a,b,c,d,e,20); R2(e,a,b,c,d,21); R2(d,e,a,b,c,22); R2(c,d,e,a,b,23);
    R2(b,c,d,e,a,24); R2(a,b,c,d,e,25); R2(e,a,b,c,d,26); R2(d,e,a,b,c,27);
    R2(c,d,e,a,b,28); R2(b,c,d,e,a,29); R2(a,b,c,d,e,30); R2(e,a,b,c,d,31);
    R2(d,e,a,b,c,32); R2(c,d,e,a,b,33); R2(b,c,d,e,a,34); R2(a,b,c,d,e,35);
    R2(e,a,b,c,d,36); R2(d,e,a,b,c,37); R2(c,d,e,a,b,38); R2(b,c,d,e,a,39);
    R3(a,b,c,d,e,40); R3(e,a,b,c,d,41); R3(d,e,a,b,c,42); R3(c,d,e,a,b,43);
    R3(b,c,d,e,a,44); R3(a,b,c,d,e,45); R3(e,a,b,c,d,46); R3(d,e,a,b,c,47);
    R3(c,d,e,a,b,48); R3(b,c,d,e,a,49); R3(a,b,c,d,e,50); R3(e,a,b,c,d,51);
    R3(d,e,a,b,c,52); R3(c,d,e,a,b,53); R3(b,c,d,e,a,54); R3(a,b,c,d,e,55);
    R3(e,a,b,c,d,56); R3(d,e,a,b,c,57); R3(c,d,e,a,b,58); R3(b,c,d,e,a,59);
    R4(a,b,c,d,e,60); R4(e,a,b,c,d,61); R4(d,e,a,b,c,62); R4(c,d,e,a,b,63);
    R4(b,c,d,e,a,64); R4(a,b,c,d,e,65); R4(e,a,b,c,d,66); R4(d,e,a,b,c,67);
    R4(c,d,e,a,b,68); R4(b,c,d,e,a,69); R4(a,b,c,d,e,70); R4(e,a,b,c,d,71);
    R4(d,e,a,b,c,72); R4(c,d,e,a,b,73); R4(b,c,d,e,a,74); R4(a,b,c,d,e,75);
    R4(e,a,b,c,d,76); R4(d,e,a,b,c,77); R4(c,d,e,a,b,78); R4(b,c,d,e,a,79);

    /* Add the working vars back into context.state[] */
    state[0] += a;
    state[1] += b;
    state[2] += c;
    state[3] += d;
    state[4] += e;

    /* Wipe variables */
    a = b = c = d = e = 0;
}